

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O0

void test_qlist_empty(void)

{
  int iVar1;
  QLIST_NODE node;
  QLIST list;
  QLIST_NODE QStack_18;
  QLIST local_10;
  
  qlist_init(&local_10);
  iVar1 = qlist_is_empty(&local_10);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x120,"%s","qlist_is_empty(&list)");
  qlist_append(&local_10,&QStack_18);
  iVar1 = qlist_is_empty(&local_10);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x122,"%s","!qlist_is_empty(&list)");
  return;
}

Assistant:

static void
test_qlist_empty(void)
{
    QLIST list;
    QLIST_NODE node;

    qlist_init(&list);

    TEST_CHECK(qlist_is_empty(&list));
    qlist_append(&list, &node);
    TEST_CHECK(!qlist_is_empty(&list));
}